

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_elements_output_commitment_free(wally_tx_output *output)

{
  wally_tx_output *output_local;
  
  if (output != (wally_tx_output *)0x0) {
    output->features = output->features & 0xfe;
    clear_and_free(output->asset,output->asset_len);
    clear_and_free(output->value,output->value_len);
    clear_and_free(output->nonce,output->nonce_len);
    clear_and_free(output->surjectionproof,output->surjectionproof_len);
    clear_and_free(output->rangeproof,output->rangeproof_len);
  }
  return 0;
}

Assistant:

int wally_tx_elements_output_commitment_free(
    struct wally_tx_output *output)
{
    (void) output;
#ifdef BUILD_ELEMENTS
    if (output) {
        output->features &= ~WALLY_TX_IS_ELEMENTS;
        clear_and_free(output->asset, output->asset_len);
        clear_and_free(output->value, output->value_len);
        clear_and_free(output->nonce, output->nonce_len);
        clear_and_free(output->surjectionproof, output->surjectionproof_len);
        clear_and_free(output->rangeproof, output->rangeproof_len);
    }
#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
}